

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::
HexFloatNeedsRoundUp<absl::lts_20250127::uint128>
          (anon_unknown_0 *this,uint128 mantissa,size_t final_nibble_displayed,uint8_t leading)

{
  bool bVar1;
  ulong nibble_index;
  uint128 uVar2;
  uint128 uVar3;
  byte local_e9;
  uint8_t round_if_odd;
  uint128 eight;
  uint128 mantissa_up_to_rounding_nibble_inclusive;
  size_t kTotalNibbles;
  size_t rounding_nibble_idx;
  uint8_t leading_local;
  size_t final_nibble_displayed_local;
  uint128 mantissa_local;
  bool local_9;
  
  nibble_index = mantissa.hi_;
  local_e9 = (byte)final_nibble_displayed;
  if (nibble_index == 0) {
    local_9 = false;
  }
  else {
    if (0x20 < nibble_index) {
      __assert_fail("final_nibble_displayed <= kTotalNibbles",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                    ,0x313,
                    "bool absl::str_format_internal::(anonymous namespace)::HexFloatNeedsRoundUp(Int, size_t, uint8_t) [Int = absl::uint128]"
                   );
    }
    uVar2 = MaskUpToNibbleInclusive<absl::lts_20250127::uint128>(nibble_index - 1);
    uVar3.hi_ = mantissa.lo_;
    uVar3.lo_ = (uint64_t)this;
    uVar3 = operator&(uVar3,uVar2);
    uVar2 = MoveToNibble<absl::lts_20250127::uint128>('\b',nibble_index - 1);
    bVar1 = lts_20250127::operator!=(uVar3,uVar2);
    if (bVar1) {
      local_9 = operator>(uVar3,uVar2);
    }
    else {
      if (nibble_index != 0x20) {
        uVar2.hi_ = mantissa.lo_;
        uVar2.lo_ = (uint64_t)this;
        local_e9 = GetNibble<absl::lts_20250127::uint128>(uVar2,nibble_index);
      }
      local_9 = (uint)local_e9 % 2 == 1;
    }
  }
  return local_9;
}

Assistant:

bool HexFloatNeedsRoundUp(Int mantissa,
                          size_t final_nibble_displayed,
                          uint8_t leading) {
  // If the last nibble (hex digit) to be displayed is the lowest on in the
  // mantissa then that means that we don't have any further nibbles to inform
  // rounding, so don't round.
  if (final_nibble_displayed == 0) {
    return false;
  }
  size_t rounding_nibble_idx = final_nibble_displayed - 1;
  constexpr size_t kTotalNibbles = sizeof(Int) * 8 / 4;
  assert(final_nibble_displayed <= kTotalNibbles);
  Int mantissa_up_to_rounding_nibble_inclusive =
      mantissa & MaskUpToNibbleInclusive<Int>(rounding_nibble_idx);
  Int eight = MoveToNibble<Int>(8, rounding_nibble_idx);
  if (mantissa_up_to_rounding_nibble_inclusive != eight) {
    return mantissa_up_to_rounding_nibble_inclusive > eight;
  }
  // Nibble in question == 8.
  uint8_t round_if_odd = (final_nibble_displayed == kTotalNibbles)
                             ? leading
                             : GetNibble(mantissa, final_nibble_displayed);
  return round_if_odd % 2 == 1;
}